

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalStatement,std::span<slang::ast::ConditionalStatement::Condition,18446744073709551615ul>,slang::ast::UniquePriorityCheck,slang::ast::Statement_const&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *args,
          UniquePriorityCheck *args_1,Statement *args_2,Statement **args_3,SourceRange *args_4)

{
  UniquePriorityCheck UVar1;
  Statement *pSVar2;
  pointer pCVar3;
  size_t sVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  ConditionalStatement *pCVar7;
  
  pCVar7 = (ConditionalStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalStatement *)this->endPtr < pCVar7 + 1) {
    pCVar7 = (ConditionalStatement *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pCVar7 + 1);
  }
  pCVar3 = (pointer)args->_M_ptr;
  sVar4 = (args->_M_extent)._M_extent_value;
  UVar1 = *args_1;
  pSVar2 = *args_3;
  SVar5 = args_4->startLoc;
  SVar6 = args_4->endLoc;
  (pCVar7->super_Statement).kind = Conditional;
  (pCVar7->super_Statement).syntax = (StatementSyntax *)0x0;
  (pCVar7->super_Statement).sourceRange.startLoc = SVar5;
  (pCVar7->super_Statement).sourceRange.endLoc = SVar6;
  (pCVar7->conditions)._M_ptr = pCVar3;
  (pCVar7->conditions)._M_extent._M_extent_value = sVar4;
  pCVar7->ifTrue = args_2;
  pCVar7->ifFalse = pSVar2;
  pCVar7->check = UVar1;
  return pCVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }